

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O2

size_t __thiscall Creature::mutate(Creature *this,double prob)

{
  type this_00;
  size_t sVar1;
  size_t sVar2;
  pointer this_01;
  double dVar3;
  
  sVar2 = 0;
  for (this_01 = (this->chroms).
                 super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_01 !=
      (this->chroms).
      super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
    this_00 = boost::shared_ptr<Chromosome>::operator->(this_01);
    sVar1 = Chromosome::mutate(this_00,prob);
    sVar2 = sVar2 + sVar1;
  }
  if (sVar2 != 0) {
    dVar3 = make_fitness(this);
    this->fitness = dVar3;
  }
  return sVar2;
}

Assistant:

size_t Creature::mutate( double prob )
{
	size_t flipctr = 0;

	for(chroms_t::iterator it = chroms.begin(); it != chroms.end(); ++it)
	{
		flipctr += (*it)->mutate(prob);
	}

	if(flipctr)
		fitness = make_fitness();

	return flipctr;
}